

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.cpp
# Opt level: O1

void __thiscall zmq::dist_t::reverse_match(dist_t *this)

{
  size_type sVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pppVar4;
  pipe_t *ppVar5;
  pipe_t *ppVar6;
  size_type sVar7;
  pipe_t *__tmp;
  
  uVar2 = this->_matching;
  uVar3 = this->_eligible;
  this->_matching = 0;
  if (uVar2 < uVar3) {
    sVar7 = 0;
    do {
      pppVar4 = (this->_pipes)._items.
                super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppVar5 = pppVar4[uVar2 + sVar7];
      if (ppVar5 != (pipe_t *)0x0) {
        *(int *)((long)&ppVar5->super_array_item_t<2> + 8) = (int)sVar7;
      }
      ppVar6 = pppVar4[sVar7];
      if (ppVar6 != (pipe_t *)0x0) {
        *(int *)((long)&ppVar6->super_array_item_t<2> + 8) = (int)uVar2 + (int)sVar7;
      }
      sVar1 = sVar7 + 1;
      pppVar4[uVar2 + sVar7] = ppVar6;
      pppVar4[sVar7] = ppVar5;
      sVar7 = sVar1;
    } while ((uVar2 - uVar3) + sVar1 != 0);
    this->_matching = sVar1;
  }
  return;
}

Assistant:

void zmq::dist_t::reverse_match ()
{
    const pipes_t::size_type prev_matching = _matching;

    // Reset matching to 0
    unmatch ();

    // Mark all matching pipes as not matching and vice-versa.
    // To do this, push all pipes that are eligible but not
    // matched - i.e. between "matching" and "eligible" -
    // to the beginning of the queue.
    for (pipes_t::size_type i = prev_matching; i < _eligible; ++i) {
        _pipes.swap (i, _matching++);
    }
}